

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::B3DImporter::ReadBB3D(B3DImporter *this,aiScene *scene)

{
  pointer *ppaVar1;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *pvVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *puVar6;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *puVar7;
  pointer pVVar8;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *puVar9;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *puVar10;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *puVar11;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *puVar12;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *puVar13;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *puVar14;
  pointer puVar15;
  __uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_> _Var16;
  iterator __position;
  pointer puVar17;
  aiAnimation *paVar18;
  undefined1 auVar19 [16];
  int iVar20;
  aiNode *paVar21;
  _func_int **pp_Var22;
  undefined8 uVar23;
  void *__src;
  bool bVar24;
  int iVar25;
  uint uVar26;
  Logger *this_00;
  ulong uVar27;
  ulong uVar28;
  undefined8 *__s;
  undefined8 *__s_00;
  aiNode *paVar29;
  aiVertexWeight *paVar30;
  aiMatrix4x4t<float> *paVar31;
  aiBone **__dest;
  pointer ppaVar32;
  aiVertexWeight this_01;
  aiMaterial **ppaVar33;
  aiMesh **ppaVar34;
  aiNodeAnim **ppaVar35;
  aiAnimation **ppaVar36;
  ulong uVar37;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *this_02;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *this_03;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *this_04;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *this_05;
  undefined8 *__s_01;
  long lVar38;
  B3DImporter *pBVar39;
  long lVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  aiBone *bone;
  FlipWindingOrderProcess flip;
  MakeLeftHandedProcess makeleft;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  string t;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  ulong local_210;
  long local_208;
  float local_1f0;
  float local_1ec;
  aiNode *local_1e8;
  FlipWindingOrderProcess local_1e0;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  undefined1 local_168 [12];
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  undefined8 uStack_130;
  void *local_e8;
  iterator iStack_e0;
  aiBone **local_d8;
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  *local_c8;
  _Head_base<0UL,_aiMesh_*,_false> local_c0;
  aiScene *local_b8;
  ulong local_b0;
  aiNode *local_a8;
  ulong local_a0;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *local_98;
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->_textures);
  puVar6 = (this->_materials).
           super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = (this->_materials).
           super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_02 = puVar6;
  if (puVar7 != puVar6) {
    do {
      std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != puVar7);
    (this->_materials).
    super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar6;
  }
  pVVar8 = (this->_vertices).
           super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_vertices).
      super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar8) {
    (this->_vertices).
    super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar8;
  }
  puVar9 = (this->_meshes).
           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (this->_meshes).
            super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_03 = puVar9;
  if (puVar10 != puVar9) {
    do {
      std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(this_03);
      this_03 = this_03 + 1;
    } while (this_03 != puVar10);
    (this->_meshes).
    super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar9;
  }
  local_98 = &this->_nodes;
  DeleteAllBarePointers<aiNode*>(local_98);
  ppaVar32 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar32) {
    (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar32;
  }
  puVar11 = (this->_nodeAnims).
            super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar12 = (this->_nodeAnims).
            super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_04 = puVar11;
  if (puVar12 != puVar11) {
    do {
      std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(this_04);
      this_04 = this_04 + 1;
    } while (this_04 != puVar12);
    (this->_nodeAnims).
    super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar11;
  }
  puVar13 = (this->_animations).
            super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar14 = (this->_animations).
            super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_05 = puVar13;
  if (puVar14 != puVar13) {
    do {
      std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::~unique_ptr(this_05);
      this_05 = this_05 + 1;
    } while (this_05 != puVar14);
    (this->_animations).
    super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar13;
  }
  ReadChunk_abi_cxx11_(&local_50,this);
  iVar25 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar25 == 0) {
    uVar26 = ReadInt(this);
    bVar24 = DefaultLogger::isNullLogger();
    if (!bVar24) {
      snprintf(local_168,0x80,"B3D file format version: %i",(ulong)uVar26);
      this_00 = DefaultLogger::get();
      Logger::info(this_00,local_168);
    }
    if ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] != this->_pos) {
      do {
        ReadChunk_abi_cxx11_((string *)local_168,this);
        iVar25 = std::__cxx11::string::compare((char *)local_168);
        if (iVar25 == 0) {
          ReadTEXS(this);
        }
        else {
          iVar25 = std::__cxx11::string::compare((char *)local_168);
          if (iVar25 == 0) {
            ReadBRUS(this);
          }
          else {
            iVar25 = std::__cxx11::string::compare((char *)local_168);
            if (iVar25 == 0) {
              ReadNODE(this,(aiNode *)0x0);
            }
          }
        }
        puVar15 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        this->_pos = puVar15[-1];
        (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar15 + -1;
        if ((undefined1 *)local_168._0_8_ != local_158) {
          operator_delete((void *)local_168._0_8_);
        }
      } while ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1] != this->_pos);
    }
  }
  puVar15 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppaVar32 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  this->_pos = puVar15[-1];
  (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar15 + -1;
  if (ppaVar32 ==
      (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_70._0_8_ = local_70 + 0x10;
    pBVar39 = (B3DImporter *)local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)pBVar39,"No nodes","");
    Fail(pBVar39,(string *)local_70);
  }
  if ((this->_meshes).
      super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_meshes).
      super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_90._0_8_ = local_90 + 0x10;
    pBVar39 = (B3DImporter *)local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)pBVar39,"No meshes","");
    Fail(pBVar39,(string *)local_90);
  }
  local_c8 = &this->_meshes;
  ppaVar32 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar32) {
    uVar27 = 0;
    local_b8 = scene;
    do {
      local_b0 = uVar27;
      if (ppaVar32[uVar27]->mNumMeshes != 0) {
        uVar37 = 0;
        local_a8 = ppaVar32[uVar27];
        do {
          _Var16._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
               (local_c8->
               super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[local_a8->mMeshes[uVar37]]._M_t.
               super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t;
          iVar25 = *(int *)((long)_Var16._M_t.
                                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8);
          iVar20 = iVar25 * 3;
          uVar27 = (ulong)iVar20;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = uVar27;
          uVar28 = SUB168(auVar19 * ZEXT816(0xc),0);
          *(int *)((long)_Var16._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 4) = iVar20;
          if (SUB168(auVar19 * ZEXT816(0xc),8) != 0) {
            uVar28 = 0xffffffffffffffff;
          }
          local_a0 = uVar37;
          __s = (undefined8 *)operator_new__(uVar28);
          if (iVar25 != 0) {
            memset(__s,0,((uVar27 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          *(undefined8 **)
           ((long)_Var16._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x10) = __s;
          if ((this->_vflags & 1) == 0) {
            __s_01 = (undefined8 *)0x0;
          }
          else {
            __s_01 = (undefined8 *)operator_new__(uVar28);
            if (iVar25 != 0) {
              memset(__s_01,0,((uVar27 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            *(undefined8 **)
             ((long)_Var16._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x18) = __s_01;
          }
          if (this->_tcsets == 0) {
            __s_00 = (undefined8 *)0x0;
          }
          else {
            __s_00 = (undefined8 *)operator_new__(uVar28);
            if (iVar25 != 0) {
              memset(__s_00,0,((uVar27 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            *(undefined8 **)
             ((long)_Var16._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x70) = __s_00;
          }
          local_208 = *(long *)((long)_Var16._M_t.
                                      super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>
                                      .super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0);
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    *)&local_1e0,
                   (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_168);
          local_c0._M_head_impl =
               (aiMesh *)
               _Var16._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
               super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
          if (0 < iVar25) {
            iVar25 = 0;
            do {
              lVar38 = 0;
              do {
                uVar27 = (ulong)*(uint *)(*(long *)(local_208 + 8) + lVar38 * 4);
                pVVar8 = (this->_vertices).
                         super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(float *)(__s + 1) = pVVar8[uVar27].vertex.z;
                *__s = *(undefined8 *)&pVVar8[uVar27].vertex;
                if (__s_01 == (undefined8 *)0x0) {
                  __s_01 = (undefined8 *)0x0;
                }
                else {
                  *(float *)(__s_01 + 1) = pVVar8[uVar27].normal.z;
                  *__s_01 = *(undefined8 *)&pVVar8[uVar27].normal;
                  __s_01 = (undefined8 *)((long)__s_01 + 0xc);
                }
                if (__s_00 == (undefined8 *)0x0) {
                  __s_00 = (undefined8 *)0x0;
                }
                else {
                  *(float *)(__s_00 + 1) = pVVar8[uVar27].texcoords.z;
                  *__s_00 = *(undefined8 *)&pVVar8[uVar27].texcoords;
                  __s_00 = (undefined8 *)((long)__s_00 + 0xc);
                }
                __s = (undefined8 *)((long)__s + 0xc);
                uVar26 = iVar25 + (int)lVar38;
                *(uint *)(*(long *)(local_208 + 8) + lVar38 * 4) = uVar26;
                lVar40 = -4;
                do {
                  fVar47 = *(float *)(pVVar8[uVar27 + 1].bones + lVar40 * 4 + -0x24);
                  if ((fVar47 == 0.0) && (!NAN(fVar47))) break;
                  pvVar2 = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                           ((long)&(((PropertyMap *)local_1e0.super_BaseProcess._vptr_BaseProcess)->
                                   _M_t)._M_impl.field_0x0 +
                           (ulong)*(byte *)((long)pVVar8[uVar27].weights + lVar40) * 3 * 8);
                  local_168._4_4_ = fVar47;
                  local_168._0_4_ = uVar26;
                  __position._M_current =
                       (pvVar2->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (pvVar2->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
                    _M_realloc_insert<aiVertexWeight>(pvVar2,__position,(aiVertexWeight *)local_168)
                    ;
                  }
                  else {
                    (__position._M_current)->mVertexId = uVar26;
                    (__position._M_current)->mWeight = fVar47;
                    ppaVar1 = &(pvVar2->
                               super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar1 = *ppaVar1 + 1;
                  }
                  lVar40 = lVar40 + 1;
                } while (lVar40 != 0);
                lVar38 = lVar38 + 1;
              } while (lVar38 != 3);
              local_208 = local_208 + 0x10;
              iVar25 = iVar25 + 3;
            } while (iVar25 < iVar20);
          }
          local_e8 = (void *)0x0;
          iStack_e0._M_current = (aiBone **)0x0;
          local_d8 = (aiBone **)0x0;
          scene = local_b8;
          if (local_1e0.super_BaseProcess.shared !=
              (SharedPostProcessInfo *)local_1e0.super_BaseProcess._vptr_BaseProcess) {
            uVar27 = 0;
            do {
              pp_Var22 = local_1e0.super_BaseProcess._vptr_BaseProcess;
              if (*(_func_int **)
                   (&(((PropertyMap *)local_1e0.super_BaseProcess._vptr_BaseProcess)->_M_t)._M_impl.
                     super__Rb_tree_header._M_header._M_color + uVar27 * 6) !=
                  *(_func_int **)
                   ((long)&(((PropertyMap *)local_1e0.super_BaseProcess._vptr_BaseProcess)->_M_t).
                           _M_impl.field_0x0 + uVar27 * 3 * 8)) {
                paVar29 = (aiNode *)operator_new(0x450);
                (paVar29->mName).length = 0;
                (paVar29->mName).data[0] = '\0';
                memset((paVar29->mName).data + 1,0x1b,0x3ff);
                (paVar29->mTransformation).a1 = 0.0;
                (paVar29->mTransformation).a2 = 0.0;
                (paVar29->mTransformation).a3 = 0.0;
                (paVar29->mTransformation).a4 = 1.0;
                (paVar29->mTransformation).b1 = 0.0;
                (paVar29->mTransformation).b2 = 0.0;
                (paVar29->mTransformation).b3 = 0.0;
                (paVar29->mTransformation).b4 = 0.0;
                (paVar29->mTransformation).c1 = 1.0;
                (paVar29->mTransformation).c2 = 0.0;
                (paVar29->mTransformation).c3 = 0.0;
                (paVar29->mTransformation).c4 = 0.0;
                (paVar29->mTransformation).d1 = 0.0;
                (paVar29->mTransformation).d2 = 1.0;
                (paVar29->mTransformation).d3 = 0.0;
                (paVar29->mTransformation).d4 = 0.0;
                *(undefined8 *)&paVar29->field_0x444 = 0;
                *(undefined4 *)((long)&paVar29->mParent + 4) = 0x3f800000;
                local_1e8 = paVar29;
                if (iStack_e0._M_current == local_d8) {
                  std::vector<aiBone*,std::allocator<aiBone*>>::_M_realloc_insert<aiBone*const&>
                            ((vector<aiBone*,std::allocator<aiBone*>> *)&local_e8,iStack_e0,
                             (aiBone **)&local_1e8);
                }
                else {
                  *iStack_e0._M_current = (aiBone *)paVar29;
                  iStack_e0._M_current = iStack_e0._M_current + 1;
                }
                paVar21 = local_1e8;
                paVar29 = (local_98->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>).
                          _M_impl.super__Vector_impl_data._M_start[uVar27];
                if (local_1e8 != paVar29) {
                  uVar26 = (paVar29->mName).length;
                  (local_1e8->mName).length = uVar26;
                  memcpy((local_1e8->mName).data,(paVar29->mName).data,(ulong)uVar26);
                  (paVar21->mName).data[uVar26] = '\0';
                }
                pvVar2 = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                         ((long)&(((PropertyMap *)pp_Var22)->_M_t)._M_impl.field_0x0 +
                         uVar27 * 3 * 8);
                (local_1e8->mTransformation).a1 =
                     (float)((ulong)((long)(pvVar2->
                                           super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pvVar2->
                                          super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 3);
                paVar30 = to_array<aiVertexWeight>(this,pvVar2);
                scene = local_b8;
                *(aiVertexWeight **)&(local_1e8->mTransformation).a2 = paVar30;
                local_168._0_4_ = (paVar29->mTransformation).a1;
                local_168._4_4_ = (paVar29->mTransformation).a2;
                unique0x100007ed = *(SharedPostProcessInfo **)&(paVar29->mTransformation).a3;
                local_158._0_4_ = (paVar29->mTransformation).b1;
                local_158._4_4_ = (paVar29->mTransformation).b2;
                fStack_150 = (paVar29->mTransformation).b3;
                fStack_14c = (paVar29->mTransformation).b4;
                local_148 = (paVar29->mTransformation).c1;
                fStack_144 = (paVar29->mTransformation).c2;
                fStack_140 = (paVar29->mTransformation).c3;
                fStack_13c = (paVar29->mTransformation).c4;
                local_138 = (paVar29->mTransformation).d1;
                fStack_134 = (paVar29->mTransformation).d2;
                uStack_130._0_4_ = (paVar29->mTransformation).d3;
                uStack_130._4_4_ = (paVar29->mTransformation).d4;
                paVar29 = paVar29->mParent;
                if (paVar29 != (aiNode *)0x0) {
                  local_1f0 = local_138;
                  local_220 = fStack_144;
                  local_1ec = fStack_134;
                  local_22c = (float)local_168._8_4_;
                  local_224 = fStack_140;
                  local_21c = (float)(undefined4)uStack_130;
                  fStack_15c = (float)((ulong)unique0x100007ed >> 0x20);
                  local_230 = fStack_15c;
                  local_228 = fStack_13c;
                  local_210 = uStack_130 >> 0x20;
                  do {
                    fVar47 = (paVar29->mTransformation).a1;
                    local_1a4 = (paVar29->mTransformation).a2;
                    fVar46 = (paVar29->mTransformation).a3;
                    local_1ac = (paVar29->mTransformation).b2;
                    local_16c = local_1ac * (float)local_158._0_4_;
                    local_1b0 = (paVar29->mTransformation).c2;
                    local_170 = local_1b0 * (float)local_158._0_4_;
                    fVar42 = (paVar29->mTransformation).d2;
                    local_1b4 = (paVar29->mTransformation).d1;
                    fVar44 = (paVar29->mTransformation).d3;
                    local_174 = local_148 * fVar44 +
                                (float)local_168._0_4_ * local_1b4 + (float)local_158._0_4_ * fVar42
                    ;
                    local_190 = (paVar29->mTransformation).b1;
                    local_1a8 = (float)local_168._0_4_ * local_190;
                    local_198 = local_1ac * (float)local_158._4_4_;
                    local_1a0 = (float)local_168._4_4_ * local_190;
                    local_194 = local_1ac * fStack_150;
                    local_1b8 = local_22c;
                    local_19c = local_22c * local_190;
                    local_190 = local_190 * local_230;
                    local_178 = (paVar29->mTransformation).c1;
                    local_18c = (float)local_168._0_4_ * local_178;
                    local_180 = local_1b0 * (float)local_158._4_4_;
                    local_188 = (float)local_168._4_4_ * local_178;
                    local_17c = local_1b0 * fStack_150;
                    local_184 = local_22c * local_178;
                    local_178 = local_178 * local_230;
                    fVar50 = (float)local_158._4_4_ * fVar42;
                    local_1bc = fStack_150 * fVar42;
                    fVar42 = fVar42 * fStack_14c;
                    fVar45 = local_230 * local_1b4;
                    fVar3 = (paVar29->mTransformation).b3;
                    local_1c4 = local_148 * fVar3;
                    local_1c0 = local_224 * fVar3;
                    fVar4 = (paVar29->mTransformation).c3;
                    fVar43 = local_228 * fVar44;
                    fVar5 = (paVar29->mTransformation).a4;
                    local_168._0_4_ =
                         local_1f0 * fVar5 +
                         local_148 * fVar46 +
                         (float)local_168._0_4_ * fVar47 + local_1a4 * (float)local_158._0_4_;
                    fVar49 = (float)local_168._4_4_ * local_1b4;
                    fVar48 = local_220 * fVar44;
                    local_168._4_4_ =
                         local_1ec * fVar5 +
                         local_220 * fVar46 +
                         (float)local_168._4_4_ * fVar47 + local_1a4 * (float)local_158._4_4_;
                    fVar41 = local_22c * local_1b4;
                    fVar44 = local_224 * fVar44;
                    local_22c = local_21c * fVar5 +
                                local_224 * fVar46 + local_22c * fVar47 + local_1a4 * fStack_150;
                    local_230 = fVar5 * (float)local_210 +
                                fVar46 * local_228 + fVar47 * local_230 + local_1a4 * fStack_14c;
                    fVar46 = local_1b0 * fStack_14c;
                    fVar47 = (paVar29->mTransformation).b4;
                    local_158._0_4_ = local_1f0 * fVar47 + local_1c4 + local_1a8 + local_16c;
                    local_158._4_4_ = local_1ec * fVar47 + local_220 * fVar3 + local_1a0 + local_198
                    ;
                    fStack_150 = local_21c * fVar47 + local_1c0 + local_19c + local_194;
                    fStack_14c = fVar47 * (float)local_210 +
                                 fVar3 * local_228 + local_190 + local_1ac * fStack_14c;
                    fVar47 = (paVar29->mTransformation).c4;
                    local_148 = local_1f0 * fVar47 + local_148 * fVar4 + local_18c + local_170;
                    local_220 = local_1ec * fVar47 + local_220 * fVar4 + local_188 + local_180;
                    local_224 = local_21c * fVar47 + local_224 * fVar4 + local_184 + local_17c;
                    local_228 = fVar47 * (float)local_210 + fVar4 * local_228 + local_178 + fVar46;
                    fVar47 = (paVar29->mTransformation).d4;
                    local_1f0 = local_1f0 * fVar47 + local_174;
                    local_1ec = local_1ec * fVar47 + fVar48 + fVar49 + fVar50;
                    local_21c = local_21c * fVar47 + fVar44 + fVar41 + local_1bc;
                    fVar47 = (float)local_210 * fVar47 + fVar43 + fVar45 + fVar42;
                    local_210 = (ulong)(uint)fVar47;
                    paVar29 = paVar29->mParent;
                  } while (paVar29 != (aiNode *)0x0);
                  fStack_144 = local_220;
                  fStack_134 = local_1ec;
                  local_138 = local_1f0;
                  stack0xfffffffffffffea0 = (SharedPostProcessInfo *)CONCAT44(local_230,local_22c);
                  fStack_13c = local_228;
                  fStack_140 = local_224;
                  uStack_130 = CONCAT44(fVar47,local_21c);
                }
                paVar31 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_168);
                fVar43 = paVar31->a1;
                fVar45 = paVar31->a2;
                fVar48 = paVar31->a3;
                fVar49 = paVar31->a4;
                fVar3 = paVar31->b1;
                fVar4 = paVar31->b2;
                fVar5 = paVar31->b3;
                fVar41 = paVar31->b4;
                fVar47 = paVar31->c1;
                fVar46 = paVar31->c2;
                fVar42 = paVar31->c3;
                fVar44 = paVar31->c4;
                paVar29 = *(aiNode **)&paVar31->d3;
                *(undefined8 *)&(local_1e8->mTransformation).d4 = *(undefined8 *)&paVar31->d1;
                local_1e8->mParent = paVar29;
                (local_1e8->mTransformation).c4 = fVar47;
                (local_1e8->mTransformation).d1 = fVar46;
                (local_1e8->mTransformation).d2 = fVar42;
                (local_1e8->mTransformation).d3 = fVar44;
                (local_1e8->mTransformation).b4 = fVar3;
                (local_1e8->mTransformation).c1 = fVar4;
                (local_1e8->mTransformation).c2 = fVar5;
                (local_1e8->mTransformation).c3 = fVar41;
                (local_1e8->mTransformation).a4 = fVar43;
                (local_1e8->mTransformation).b1 = fVar45;
                (local_1e8->mTransformation).b2 = fVar48;
                (local_1e8->mTransformation).b3 = fVar49;
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 < (ulong)(((long)local_1e0.super_BaseProcess.shared -
                                       (long)local_1e0.super_BaseProcess._vptr_BaseProcess >> 3) *
                                     -0x5555555555555555));
          }
          __src = local_e8;
          uVar27 = (long)iStack_e0._M_current - (long)local_e8 >> 3;
          *(uint *)((long)local_c0._M_head_impl + 0xd8) = (uint)uVar27;
          if ((long)iStack_e0._M_current - (long)local_e8 == 0) {
            __dest = (aiBone **)0x0;
          }
          else {
            __dest = (aiBone **)
                     operator_new__(-(ulong)(uVar27 >> 0x3d != 0) |
                                    (long)iStack_e0._M_current - (long)local_e8);
            memcpy(__dest,__src,(uVar27 + (uVar27 == 0)) * 8);
          }
          (local_c0._M_head_impl)->mBones = __dest;
          if (__src != (void *)0x0) {
            operator_delete(__src);
          }
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                     *)&local_1e0);
          uVar37 = local_a0 + 1;
        } while (uVar37 < local_a8->mNumMeshes);
      }
      uVar27 = local_b0 + 1;
      ppaVar32 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar27 < (ulong)((long)(this->_nodes).
                                    super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppaVar32 >> 3));
  }
  scene->mRootNode = *ppaVar32;
  ppaVar32 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar32) {
    (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar32;
  }
  if ((this->_materials).
      super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_materials).
      super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_01 = (aiVertexWeight)operator_new(0x10);
    aiMaterial::aiMaterial((aiMaterial *)this_01);
    local_168._0_8_ = this_01;
    std::
    vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
    ::emplace_back<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>
              ((vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
                *)&this->_materials,
               (unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)local_168);
    uVar23 = local_168._0_8_;
    if ((aiVertexWeight)local_168._0_8_ != (aiVertexWeight)0x0) {
      aiMaterial::~aiMaterial((aiMaterial *)local_168._0_8_);
      operator_delete((void *)uVar23);
    }
  }
  scene->mNumMaterials =
       (uint)((ulong)((long)(this->_materials).
                            super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_materials).
                           super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
  ppaVar33 = unique_to_array<aiMaterial>(&this->_materials);
  scene->mMaterials = ppaVar33;
  scene->mNumMeshes =
       (uint)((ulong)((long)(this->_meshes).
                            super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_meshes).
                           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
  ppaVar34 = unique_to_array<aiMesh>(local_c8);
  scene->mMeshes = ppaVar34;
  puVar17 = (this->_animations).
            super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)puVar17 -
       (long)(this->_animations).
             super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start == 8) &&
     (uVar27 = (long)(this->_nodeAnims).
                     super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_nodeAnims).
                     super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, uVar27 != 0)) {
    paVar18 = puVar17[-1]._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
              ._M_t.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
              super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl;
    paVar18->mNumChannels = (uint)(uVar27 >> 3);
    ppaVar35 = unique_to_array<aiNodeAnim>(&this->_nodeAnims);
    paVar18->mChannels = ppaVar35;
    scene->mNumAnimations =
         (uint)((ulong)((long)(this->_animations).
                              super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_animations).
                             super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    ppaVar36 = unique_to_array<aiAnimation>(&this->_animations);
    scene->mAnimations = ppaVar36;
  }
  MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)local_168);
  MakeLeftHandedProcess::Execute((MakeLeftHandedProcess *)local_168,scene);
  FlipWindingOrderProcess::FlipWindingOrderProcess(&local_1e0);
  FlipWindingOrderProcess::Execute(&local_1e0,scene);
  FlipWindingOrderProcess::~FlipWindingOrderProcess(&local_1e0);
  MakeLeftHandedProcess::~MakeLeftHandedProcess((MakeLeftHandedProcess *)local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void B3DImporter::ReadBB3D( aiScene *scene ){

    _textures.clear();

    _materials.clear();

    _vertices.clear();

    _meshes.clear();

    DeleteAllBarePointers(_nodes);
    _nodes.clear();

    _nodeAnims.clear();

    _animations.clear();

    string t=ReadChunk();
    if( t=="BB3D" ){
        int version=ReadInt();

        if (!DefaultLogger::isNullLogger()) {
            char dmp[128];
            ai_snprintf(dmp, 128, "B3D file format version: %i",version);
            ASSIMP_LOG_INFO(dmp);
        }

        while( ChunkSize() ){
            string t=ReadChunk();
            if( t=="TEXS" ){
                ReadTEXS();
            }else if( t=="BRUS" ){
                ReadBRUS();
            }else if( t=="NODE" ){
                ReadNODE( 0 );
            }
            ExitChunk();
        }
    }
    ExitChunk();

    if( !_nodes.size() ) Fail( "No nodes" );

    if( !_meshes.size() ) Fail( "No meshes" );

    //Fix nodes/meshes/bones
    for(size_t i=0;i<_nodes.size();++i ){
        aiNode *node=_nodes[i];

        for( size_t j=0;j<node->mNumMeshes;++j ){
            aiMesh *mesh = _meshes[node->mMeshes[j]].get();

            int n_tris=mesh->mNumFaces;
            int n_verts=mesh->mNumVertices=n_tris * 3;

            aiVector3D *mv=mesh->mVertices=new aiVector3D[ n_verts ],*mn=0,*mc=0;
            if( _vflags & 1 ) mn=mesh->mNormals=new aiVector3D[ n_verts ];
            if( _tcsets ) mc=mesh->mTextureCoords[0]=new aiVector3D[ n_verts ];

            aiFace *face=mesh->mFaces;

            vector< vector<aiVertexWeight> > vweights( _nodes.size() );

            for( int i=0;i<n_verts;i+=3 ){
                for( int j=0;j<3;++j ){
                    Vertex &v=_vertices[face->mIndices[j]];

                    *mv++=v.vertex;
                    if( mn ) *mn++=v.normal;
                    if( mc ) *mc++=v.texcoords;

                    face->mIndices[j]=i+j;

                    for( int k=0;k<4;++k ){
                        if( !v.weights[k] ) break;

                        int bone=v.bones[k];
                        float weight=v.weights[k];

                        vweights[bone].push_back( aiVertexWeight(i+j,weight) );
                    }
                }
                ++face;
            }

            vector<aiBone*> bones;
            for(size_t i=0;i<vweights.size();++i ){
                vector<aiVertexWeight> &weights=vweights[i];
                if( !weights.size() ) continue;

                aiBone *bone=new aiBone;
                bones.push_back( bone );

                aiNode *bnode=_nodes[i];

                bone->mName=bnode->mName;
                bone->mNumWeights= static_cast<unsigned int>(weights.size());
                bone->mWeights=to_array( weights );

                aiMatrix4x4 mat=bnode->mTransformation;
                while( bnode->mParent ){
                    bnode=bnode->mParent;
                    mat=bnode->mTransformation * mat;
                }
                bone->mOffsetMatrix=mat.Inverse();
            }
            mesh->mNumBones= static_cast<unsigned int>(bones.size());
            mesh->mBones=to_array( bones );
        }
    }

    //nodes
    scene->mRootNode=_nodes[0];
    _nodes.clear();  // node ownership now belongs to scene

    //material
    if( !_materials.size() ){
        _materials.emplace_back( std::unique_ptr<aiMaterial>(new aiMaterial) );
    }
    scene->mNumMaterials= static_cast<unsigned int>(_materials.size());
    scene->mMaterials = unique_to_array( _materials );

    //meshes
    scene->mNumMeshes= static_cast<unsigned int>(_meshes.size());
    scene->mMeshes = unique_to_array( _meshes );

    //animations
    if( _animations.size()==1 && _nodeAnims.size() ){

        aiAnimation *anim = _animations.back().get();
        anim->mNumChannels=static_cast<unsigned int>(_nodeAnims.size());
        anim->mChannels = unique_to_array( _nodeAnims );

        scene->mNumAnimations=static_cast<unsigned int>(_animations.size());
        scene->mAnimations=unique_to_array( _animations );
    }

    // convert to RH
    MakeLeftHandedProcess makeleft;
    makeleft.Execute( scene );

    FlipWindingOrderProcess flip;
    flip.Execute( scene );
}